

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ProcessTRow::operator()
          (ProcessTRow *this,iterator_t *str,iterator_t end)

{
  uint uVar1;
  ParserDPOMDPFormat_Spirit *pPVar2;
  vector<double,_std::allocator<double>_> *__x;
  pointer puVar3;
  iterator __position;
  TransitionModelDiscrete *pTVar4;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  uint *local_1e8;
  vector<double,_std::allocator<double>_> local_1e0;
  uint *local_1c8;
  uint *local_1c0;
  uint local_1b8 [4];
  ostream local_1a8 [376];
  
  pPVar2 = this->_m_po;
  if ((long)(pPVar2->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pPVar2->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != 4) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"ProcessTRow:_m_lp_fromSI has size != 1. (at ",0x2c);
    poVar7 = DPOMDPFormatParsing::operator<<(local_1a8,&str->_pos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::endl<char,std::char_traits<char>>(poVar7);
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar8 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar8,&E::typeinfo,E::~E);
  }
  __x = (pPVar2->_m_curMatrix).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(pPVar2->_m_curMatrix).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)__x == 0x30) &&
     (__x[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      __x[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start)) {
    std::vector<double,_std::allocator<double>_>::vector(&local_1e0,__x);
    uVar5 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                                   super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))();
    if ((long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar5) {
      pPVar2 = this->_m_po;
      puVar3 = (pPVar2->_m_lp_fromSI).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*puVar3 == pPVar2->_m_anyStateIndex) {
        if ((pPVar2->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar3) {
          (pPVar2->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar3;
        }
        uVar9 = 0;
        while( true ) {
          local_1b8[0] = uVar9;
          uVar6 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                                         super_MultiAgentDecisionProcessDiscrete).
                                         super_MultiAgentDecisionProcess + 0x30))();
          if (uVar6 <= uVar9) break;
          pPVar2 = this->_m_po;
          __position._M_current =
               (pPVar2->_m_lp_fromSI).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pPVar2->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar2->_m_lp_fromSI,
                       __position,local_1b8);
          }
          else {
            *__position._M_current = local_1b8[0];
            (pPVar2->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar9 = local_1b8[0] + 1;
        }
      }
      local_1e8 = (this->_m_po->_m_lp_fromSI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1c8 = (this->_m_po->_m_lp_fromSI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      if (local_1e8 != local_1c8) {
        do {
          puVar11 = (this->_m_po->_m_lp_JAI).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_1c0 = (this->_m_po->_m_lp_JAI).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          if (puVar11 != local_1c0) {
            uVar9 = *local_1e8;
            do {
              if (uVar5 != 0) {
                uVar1 = *puVar11;
                uVar10 = 1;
                uVar6 = 0;
                do {
                  pTVar4 = (this->_m_po->_m_decPOMDPDiscrete->
                           super_MultiAgentDecisionProcessDiscrete)._m_p_tModel;
                  (*(pTVar4->super_TransitionModelDiscreteInterface).super_TransitionModel.
                    _vptr_TransitionModel[5])
                            (local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar6],pTVar4,(ulong)uVar9,
                             (ulong)uVar1,(ulong)(uVar10 - 1));
                  uVar6 = (ulong)uVar10;
                  uVar10 = uVar10 + 1;
                } while (uVar6 < uVar5);
              }
              puVar11 = puVar11 + 1;
            } while (puVar11 != local_1c0);
          }
          local_1e8 = local_1e8 + 1;
        } while (local_1e8 != local_1c8);
      }
      if (local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"ProcessTRow: exected a row matrix with nrStates=",0x30);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," entries. Found ",0x10);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," entries. (at ",0xe);
    poVar7 = DPOMDPFormatParsing::operator<<(poVar7,&str->_pos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::endl<char,std::char_traits<char>>(poVar7);
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar8 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar8,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"ProcessTRow: a row matrix should have been parsed. (at ",0x37);
  poVar7 = DPOMDPFormatParsing::operator<<(local_1a8,&str->_pos);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
  std::endl<char,std::char_traits<char>>(poVar7);
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar8 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar8,&E::typeinfo,E::~E);
}

Assistant:

void ParserDPOMDPFormat_Spirit::ProcessTRow::operator()(iterator_t str, iterator_t end) const
{
    if( _m_po->_m_lp_fromSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessTRow:_m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( !_m_po->IsRowMatrixLP() )
    {
        stringstream ss; ss<<"ProcessTRow: a row matrix should have been parsed. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    vector<double> row = _m_po->_m_curMatrix[0];
    size_t nrS = _m_po->GetDecPOMDPDiscrete()->GetNrStates();
    if( row.size() != nrS)
    {
        stringstream ss; ss<<"ProcessTRow: exected a row matrix with nrStates="<<nrS<<" entries. Found "<<row.size()<< " entries. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }

    Index sI = _m_po->_m_lp_fromSI[0];
    Index jaI = 0;
    if( sI == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_fromSI.clear();
        for(Index si=0; si < _m_po->GetDecPOMDPDiscrete()->GetNrStates();si++)
            _m_po->_m_lp_fromSI.push_back(si);
    }

    vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
    vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
    while(sI_it != sI_last)
    {
        sI = *sI_it;
        vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
        vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
        while(jaI_it != jaI_last)
        {
            jaI = *jaI_it;
            for(Index sucSI=0; sucSI < nrS; sucSI++)
            {
                _m_po->GetDecPOMDPDiscrete()->SetTransitionProbability
                    (sI, jaI, sucSI, row[sucSI]);
                if(DEBUG_PARSE)
                    cout << "Setting T("<<sI<<","<<jaI<<","<<
                        sucSI<<") = "<<row[sucSI]<<endl;
            }
            jaI_it++;
        }
        sI_it++;
    }
}